

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O1

WebPIDecoder * NewDecoder(WebPDecBuffer *output_buffer,WebPBitstreamFeatures *features)

{
  WebPDecBuffer *buffer;
  int iVar1;
  WebPIDecoder *ptr;
  
  ptr = (WebPIDecoder *)WebPSafeCalloc(1,0x1f0);
  if (ptr != (WebPIDecoder *)0x0) {
    ptr->state_ = STATE_WEBP_HEADER;
    ptr->chunk_size_ = 0;
    ptr->last_mb_y_ = -1;
    (ptr->mem_).mode_ = MEM_MODE_NONE;
    (ptr->mem_).buf_size_ = 0;
    (ptr->mem_).buf_ = (uint8_t *)0x0;
    (ptr->mem_).part0_size_ = 0;
    (ptr->mem_).part0_buf_ = (uint8_t *)0x0;
    buffer = &ptr->output_;
    iVar1 = WebPInitDecBufferInternal(buffer,0x209);
    if (iVar1 != 0) {
      iVar1 = VP8InitIoInternal(&ptr->io_,0x209);
      if (iVar1 != 0) {
        WebPResetDecParams(&ptr->params_);
        if (output_buffer == (WebPDecBuffer *)0x0) {
          (ptr->params_).output = buffer;
          ptr->final_output_ = (WebPDecBuffer *)0x0;
        }
        else {
          iVar1 = WebPAvoidSlowMemory(output_buffer,features);
          if (iVar1 == 0) {
            (ptr->params_).output = output_buffer;
            ptr->final_output_ = (WebPDecBuffer *)0x0;
          }
          else {
            (ptr->params_).output = buffer;
            ptr->final_output_ = output_buffer;
            if (output_buffer != (WebPDecBuffer *)0x0) {
              buffer->colorspace = output_buffer->colorspace;
            }
          }
        }
        WebPInitCustomIo(&ptr->params_,&ptr->io_);
        return ptr;
      }
    }
    WebPSafeFree(ptr);
  }
  return (WebPIDecoder *)0x0;
}

Assistant:

WEBP_NODISCARD static WebPIDecoder* NewDecoder(
    WebPDecBuffer* const output_buffer,
    const WebPBitstreamFeatures* const features) {
  WebPIDecoder* idec = (WebPIDecoder*)WebPSafeCalloc(1ULL, sizeof(*idec));
  if (idec == NULL) {
    return NULL;
  }

  idec->state_ = STATE_WEBP_HEADER;
  idec->chunk_size_ = 0;

  idec->last_mb_y_ = -1;

  InitMemBuffer(&idec->mem_);
  if (!WebPInitDecBuffer(&idec->output_) || !VP8InitIo(&idec->io_)) {
    WebPSafeFree(idec);
    return NULL;
  }

  WebPResetDecParams(&idec->params_);
  if (output_buffer == NULL || WebPAvoidSlowMemory(output_buffer, features)) {
    idec->params_.output = &idec->output_;
    idec->final_output_ = output_buffer;
    if (output_buffer != NULL) {
      idec->params_.output->colorspace = output_buffer->colorspace;
    }
  } else {
    idec->params_.output = output_buffer;
    idec->final_output_ = NULL;
  }
  WebPInitCustomIo(&idec->params_, &idec->io_);  // Plug the I/O functions.

  return idec;
}